

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_load.cpp
# Opt level: O1

bool __thiscall FScriptLoader::ParseInfo(FScriptLoader *this,MapData *map)

{
  FileReader *pFVar1;
  long lVar2;
  level_info_t *plVar3;
  Node *pNVar4;
  int lump;
  int iVar5;
  uint uVar6;
  DFraggleThinker *this_00;
  char *pcVar7;
  FOptionalMapinfoData *pFVar8;
  Node *pNVar9;
  undefined1 uVar10;
  char *pcVar11;
  byte bVar12;
  char *unaff_R14;
  FString scriptsrc;
  FString local_38;
  
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  local_38.Chars = FString::NullString.Nothing;
  this->IgnoreInfo = false;
  pFVar1 = map->MapLumps[0].Reader;
  if (pFVar1 == (FileReader *)0x0) {
    iVar5 = 0;
  }
  else {
    iVar5 = (int)pFVar1->Length;
  }
  if (iVar5 == 0) {
    lump = FWadCollection::CheckNumForName(&Wads,"FSGLOBAL",0);
    if ((lump < 0) || (iVar5 = FWadCollection::LumpLength(&Wads,lump), iVar5 == 0)) {
      iVar5 = 0;
      bVar12 = 0;
    }
    else {
      unaff_R14 = (char *)operator_new__((long)(iVar5 + 3));
      FWadCollection::ReadLump(&Wads,lump,unaff_R14);
      bVar12 = 1;
    }
    if (bVar12 == 0) {
      uVar10 = 0;
      goto LAB_00510253;
    }
  }
  else {
    unaff_R14 = (char *)operator_new__((long)(iVar5 + 3));
    lVar2 = pFVar1->Length;
    map->file = pFVar1;
    (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar1,0,0);
    (*(map->file->super_FileReaderBase)._vptr_FileReaderBase[2])
              (map->file,unaff_R14,(long)(int)lVar2);
    bVar12 = 0;
  }
  (unaff_R14 + iVar5)[0] = '\n';
  (unaff_R14 + iVar5)[1] = '\r';
  unaff_R14[(long)iVar5 + 2] = '\0';
  this->HasScripts = false;
  this->readtype = RT_OTHER;
  this->drownflag = -1;
  if (-2 < iVar5) {
    pcVar11 = unaff_R14;
    pcVar7 = unaff_R14;
    do {
      if (*pcVar11 == '\n') {
        *pcVar11 = '\0';
        if (this->IgnoreInfo == false) {
          ParseInfoCmd(this,pcVar7,&local_38);
        }
        pcVar7 = pcVar11 + 1;
        *pcVar11 = '\n';
      }
      pcVar11 = pcVar11 + 1;
    } while (pcVar11 < unaff_R14 + (long)iVar5 + 2);
  }
  if (this->HasScripts == true) {
    this_00 = (DFraggleThinker *)
              M_Malloc_Dbg(0x60,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                           ,0x1f9);
    DFraggleThinker::DFraggleThinker(this_00);
    pcVar7 = copystring(local_38.Chars);
    *(char **)(*(long *)((long)DFraggleThinker::ActiveThinker.field_0 + 0x38) + 0x28) = pcVar7;
    if (this->drownflag == -1) {
      this->drownflag = (uint)(bVar12 | level.maptype != MAPTYPE_DOOM);
    }
    plVar3 = level.info;
    if (this->drownflag == 0) {
      level.airsupply = 0;
    }
    uVar6 = FName::NameManager::FindName(&FName::NameData,"fragglescript",false);
    pNVar4 = (plVar3->optdata).Nodes + ((plVar3->optdata).Size - 1 & uVar6);
    do {
      pNVar9 = pNVar4;
      if ((pNVar9 == (Node *)0x0) || (pNVar9->Next == (Node *)0x1)) {
        pNVar9 = (Node *)0x0;
        break;
      }
      pNVar4 = pNVar9->Next;
    } while ((pNVar9->Pair).Key.Index != uVar6);
    if (pNVar9 == (Node *)0x0) {
      pFVar8 = (FOptionalMapinfoData *)0x0;
    }
    else {
      pFVar8 = (pNVar9->Pair).Value.Ptr;
    }
    if (pFVar8 != (FOptionalMapinfoData *)0x0) {
      *(undefined1 *)((long)DFraggleThinker::ActiveThinker.field_0 + 0x58) = pFVar8->field_0x14;
    }
  }
  if (unaff_R14 != (char *)0x0) {
    operator_delete__(unaff_R14);
  }
  uVar10 = this->HasScripts;
LAB_00510253:
  FString::~FString(&local_38);
  return (bool)uVar10;
}

Assistant:

bool FScriptLoader::ParseInfo(MapData * map)
{
	char *lump;
	char *rover;
	char *startofline;
	int lumpsize;
	bool fsglobal=false;
	FString scriptsrc;

	// Global initializazion if not done yet.
	static bool done=false;
					
	// Load the script lump
	IgnoreInfo = false;
	lumpsize = map->Size(0);
	if (lumpsize==0)
	{
		// Try a global FS lump
		int lumpnum=Wads.CheckNumForName("FSGLOBAL");
		if (lumpnum<0) return false;
		lumpsize=Wads.LumpLength(lumpnum);
		if (lumpsize==0) return false;
		fsglobal=true;
		lump=new char[lumpsize+3];
		Wads.ReadLump(lumpnum,lump);
	}
	else
	{
		lump=new char[lumpsize+3];
		map->Read(0, lump);
	}
	// Append a new line. The parser likes to crash when the last character is a valid token.
	lump[lumpsize]='\n';
	lump[lumpsize+1]='\r';
	lump[lumpsize+2]=0;
	lumpsize+=2;
	
	rover = startofline = lump;
	HasScripts=false;
	drownflag=-1;

	readtype = RT_OTHER;
	while(rover < lump+lumpsize)
    {
		if(*rover == '\n') // end of line
		{
			*rover = 0;               // make it an end of string (0)
			if (!IgnoreInfo) ParseInfoCmd(startofline, scriptsrc);
			startofline = rover+1; // next line
			*rover = '\n';            // back to end of line
		}
		rover++;
    }
	if (HasScripts) 
	{
		new DFraggleThinker;
		DFraggleThinker::ActiveThinker->LevelScript->data = copystring(scriptsrc.GetChars());

		if (drownflag==-1) drownflag = (level.maptype != MAPTYPE_DOOM || fsglobal);
		if (!drownflag) level.airsupply=0;	// Legacy doesn't to water damage so we need to check if it has to be disabled here.

		FFsOptions *opt = level.info->GetOptData<FFsOptions>("fragglescript", false);
		if (opt != NULL)
		{
			DFraggleThinker::ActiveThinker->nocheckposition = opt->nocheckposition;
		}
	}


	delete[] lump;
	return HasScripts;
}